

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,double *value)

{
  bool bVar1;
  value_type_conflict3 *pvVar2;
  ostream *poVar3;
  string value_str;
  expected<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  flt;
  double v;
  string local_200;
  expected<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e0;
  string local_1b8;
  double local_198 [47];
  
  bVar1 = MaybeNonFinite<double>(this,local_198);
  if (bVar1) {
    *value = local_198[0];
    local_1e0.contained.
    super_storage_t_impl<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_has_value = true;
  }
  else {
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    local_200._M_string_length = 0;
    local_200.field_2._M_local_buf[0] = '\0';
    bVar1 = LexFloat(this,&local_200);
    if (bVar1) {
      anon_unknown_3::ParseDouble(&local_1e0,&local_200);
      if (local_1e0.contained.
          super_storage_t_impl<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value == false) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
        poVar3 = ::std::operator<<((ostream *)local_198,"[error]");
        poVar3 = ::std::operator<<(poVar3,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-basetype.cc"
                                  );
        poVar3 = ::std::operator<<(poVar3,":");
        poVar3 = ::std::operator<<(poVar3,"ReadBasicType");
        poVar3 = ::std::operator<<(poVar3,"():");
        poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xb38);
        ::std::operator<<(poVar3," ");
        poVar3 = ::std::operator<<((ostream *)local_198,"Failed to parse floating value.");
        ::std::operator<<(poVar3,"\n");
        ::std::__cxx11::stringbuf::str();
        PushError(this,&local_1b8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
      }
      else {
        pvVar2 = nonstd::expected_lite::
                 expected<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&local_1e0);
        *value = *pvVar2;
      }
      nonstd::expected_lite::
      expected<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected(&local_1e0);
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
      poVar3 = ::std::operator<<((ostream *)local_198,"[error]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-basetype.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"ReadBasicType");
      poVar3 = ::std::operator<<(poVar3,"():");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xb33);
      ::std::operator<<(poVar3," ");
      poVar3 = ::std::operator<<((ostream *)local_198,"Failed to lex floating value literal.");
      ::std::operator<<(poVar3,"\n");
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&local_1e0);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
      local_1e0.contained.
      super_storage_t_impl<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .m_has_value = false;
    }
    ::std::__cxx11::string::_M_dispose();
  }
  return local_1e0.contained.
         super_storage_t_impl<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .m_has_value;
}

Assistant:

bool AsciiParser::ReadBasicType(double *value) {
  // -inf, inf, nan
  {
    double v;
    if (MaybeNonFinite(&v)) {
      (*value) = v;
      return true;
    }
  }

  std::string value_str;
  if (!LexFloat(&value_str)) {
    PUSH_ERROR_AND_RETURN("Failed to lex floating value literal.");
  }

  auto flt = ParseDouble(value_str);
  if (!flt) {
    PUSH_ERROR_AND_RETURN("Failed to parse floating value.");
  } else {
    (*value) = flt.value();
  }

  return true;
}